

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O2

void EXPLORE_EVAL::output_example(vw *all,explore_eval *c,example *ec,multi_ex *ec_seq)

{
  int iVar1;
  action_score *paVar2;
  int *piVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  bool bVar8;
  ulong uVar9;
  ostream *poVar10;
  pointer ppeVar11;
  long lVar12;
  uint uVar13;
  size_t num_features;
  size_t i;
  ulong uVar14;
  int *piVar15;
  float *pfVar16;
  vw *all_00;
  float loss;
  float fVar17;
  undefined8 in_stack_fffffffffffffde8;
  vw *pvVar18;
  example *ec_00;
  undefined4 in_stack_fffffffffffffe00;
  float fVar19;
  string local_1f8 [32];
  string outputString;
  stringstream outputStringStream;
  ostream local_1a8;
  
  bVar8 = CB_ALGS::example_is_newline_not_header(ec);
  if (!bVar8) {
    ppeVar11 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    paVar2 = ((*ppeVar11)->pred).a_s._begin;
    pfVar16 = ((*ppeVar11)->pred).scalars._end;
    num_features = 0;
    for (uVar14 = 0;
        uVar9 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppeVar11 >> 3, uVar14 < uVar9;
        uVar14 = uVar14 + 1) {
      bVar8 = CB::ec_is_example_header(ppeVar11[uVar14]);
      ppeVar11 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      if (!bVar8) {
        num_features = num_features + ppeVar11[uVar14]->num_features;
      }
    }
    fVar19 = (c->known_cost).probability;
    loss = 0.0;
    bVar8 = 0.0 < fVar19;
    if (0.0 < fVar19) {
      for (uVar13 = 0; uVar14 = (ulong)uVar13, uVar14 < (ulong)((long)pfVar16 - (long)paVar2 >> 3);
          uVar13 = uVar13 + 1) {
        fVar17 = (c->known_cost).cost / fVar19;
        if ((c->known_cost).action != paVar2[uVar14].action) {
          fVar17 = 0.0;
        }
        loss = loss + fVar17 * paVar2[uVar14].score;
      }
    }
    for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
      bVar8 = (bool)(bVar8 & ppeVar11[uVar14]->test_only);
    }
    all_00 = all;
    ec_00 = ec;
    shared_data::update(all->sd,bVar8,0.0 < fVar19,loss,ec->weight,num_features);
    piVar3 = (all->final_prediction_sink)._end;
    for (piVar15 = (all->final_prediction_sink)._begin; piVar15 != piVar3; piVar15 = piVar15 + 1) {
      ACTION_SCORE::print_action_score
                (*piVar15,(v_array<ACTION_SCORE::action_score> *)&(ec->pred).scalars,&ec->tag);
    }
    if (0 < all_00->raw_prediction) {
      outputString._M_dataplus._M_p = (pointer)&outputString.field_2;
      outputString._M_string_length = 0;
      outputString.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&outputStringStream,(string *)&outputString,_S_out|_S_in);
      pwVar4 = (ec_00->l).cs.costs._begin;
      pwVar5 = (ec_00->l).cs.costs._end;
      pfVar16 = &pwVar4->wap_value;
      for (lVar12 = 0; (long)pwVar5 - (long)pwVar4 >> 4 != lVar12; lVar12 = lVar12 + 1) {
        if (lVar12 != 0) {
          std::operator<<(&local_1a8,' ');
        }
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        poVar10 = std::operator<<(poVar10,':');
        std::ostream::operator<<(poVar10,*pfVar16);
        pfVar16 = pfVar16 + 4;
      }
      p_Var6 = all_00->print_text;
      iVar1 = all_00->raw_prediction;
      pvVar18 = all_00;
      std::__cxx11::stringbuf::str();
      vVar7._end = (char *)pvVar18;
      vVar7._begin = (char *)in_stack_fffffffffffffde8;
      vVar7.end_array = (char *)ec_00;
      vVar7.erase_count._0_4_ = in_stack_fffffffffffffe00;
      vVar7.erase_count._4_4_ = fVar19;
      (*p_Var6)(iVar1,(string)ec->tag,vVar7);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
      std::__cxx11::string::~string((string *)&outputString);
    }
    CB::print_update(all_00,fVar19 <= 0.0,ec_00,ec_seq,true);
  }
  return;
}

Assistant:

void output_example(vw& all, explore_eval& c, example& ec, multi_ex* ec_seq)
{
  if (example_is_newline_not_header(ec))
    return;

  size_t num_features = 0;

  float loss = 0.;
  ACTION_SCORE::action_scores preds = (*ec_seq)[0]->pred.a_s;

  for (size_t i = 0; i < (*ec_seq).size(); i++)
    if (!CB::ec_is_example_header(*(*ec_seq)[i]))
      num_features += (*ec_seq)[i]->num_features;

  bool labeled_example = true;
  if (c.known_cost.probability > 0)
  {
    for (uint32_t i = 0; i < preds.size(); i++)
    {
      float l = get_unbiased_cost(&c.known_cost, preds[i].action);
      loss += l * preds[i].score;
    }
  }
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq->size(); i++) holdout_example &= (*ec_seq)[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, ec_seq, true);
}